

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

void __thiscall Kernel::Term::Term(Term *this,Term *t)

{
  this->_vptr_Term = (_func_int **)&PTR_computable_009ff6b0;
  this->_functor = t->_functor;
  *(uint *)&this->field_0xc = *(uint *)&t->field_0xc & 0xfffffff;
  this->_weight = 0;
  this->_kboWeight = -1;
  (this->field_9)._vars = 0;
  this->_args[0]._content = 2;
  this->_args[0]._content = t->_args[0]._content & 0xffffffff00000077 | 0xfffffc00;
  return;
}

Assistant:

Term::Term(const Term& t) throw()
  : _functor(t._functor),
    _arity(t._arity),
    _color(COLOR_TRANSPARENT),
    _hasInterpretedConstants(0),
    _isTwoVarEquality(0),
    _weight(0),
    _kboWeight(-1),
#if VDEBUG
    _kboInstance(nullptr),
#endif
    _vars(0)
{
  ASS(!isSpecial()); //we do not copy special terms

  _args[0] = t._args[0];
  _args[0]._setShared(false);
  _args[0]._setOrder(AO_UNKNOWN);
  _args[0]._setDistinctVars(TERM_DIST_VAR_UNKNOWN);
}